

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chromecast.h
# Opt level: O3

bool cc::sendMessage(Connection *conn,string *ns,string *message)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  ostream *poVar4;
  bool bVar5;
  basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
  buffer;
  basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
  contents;
  uint *local_128;
  long local_120;
  uint local_118;
  uint uStack_114;
  basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
  local_108;
  undefined **local_e8;
  ulong local_e0;
  undefined1 *local_d8;
  char *local_d0;
  undefined1 local_c8;
  undefined7 uStack_c7;
  undefined1 *local_b8;
  undefined8 local_b0;
  undefined1 local_a8;
  undefined7 uStack_a7;
  undefined1 *local_98;
  undefined8 local_90;
  undefined1 local_88;
  undefined7 uStack_87;
  undefined4 local_78;
  undefined1 *local_70;
  undefined8 local_68;
  undefined1 local_60;
  undefined7 uStack_5f;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  if (s_verbose) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Sending to \'",0xc);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,dest_abi_cxx11_,DAT_0012a8e8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\': \'",4);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,(ns->_M_dataplus)._M_p,ns->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,": \'",3);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,(message->_M_dataplus)._M_p,message->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\'",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
  }
  local_d8 = &local_c8;
  local_e0 = 0;
  local_e8 = &PTR__CastMessage_00129a40;
  local_d0 = (char *)0x0;
  local_c8 = 0;
  local_b8 = &local_a8;
  local_b0 = 0;
  local_a8 = 0;
  local_98 = &local_88;
  local_90 = 0;
  local_88 = 0;
  local_70 = &local_60;
  local_68 = 0;
  local_60 = 0;
  local_48 = 0;
  local_40 = 0;
  local_78 = 0;
  local_50 = &local_40;
  std::__cxx11::string::_M_assign((string *)&local_98);
  std::__cxx11::string::_M_replace((ulong)&local_d8,0,local_d0,0x11e4b3);
  local_128 = &local_118;
  if (DAT_0012a8e8 == 0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"receiver-0","");
  }
  else {
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_128,dest_abi_cxx11_,dest_abi_cxx11_ + DAT_0012a8e8);
  }
  std::__cxx11::string::operator=((string *)&local_b8,(string *)&local_128);
  if (local_128 != &local_118) {
    operator_delete(local_128,CONCAT44(uStack_114,local_118) + 1);
  }
  std::__cxx11::string::_M_assign((string *)&local_70);
  uVar2 = (*(code *)local_e8[3])();
  local_118 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
  local_120 = 4;
  uStack_114 = uStack_114 & 0xffffff00;
  local_108._M_string_length = 0;
  local_108.field_2._M_local_buf[0] = '\0';
  local_128 = &local_118;
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  std::__cxx11::
  basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>::
  reserve(&local_108,0x400);
  local_e0 = local_e0 & 0xffffffff00000000;
  cVar1 = (*(code *)local_e8[4])(&local_e8,&local_128);
  if (cVar1 == '\0') {
    puts("Failed to serialize");
    bVar5 = false;
  }
  else {
    iVar3 = ssl::SSL_write((SSL *)conn->handle,local_128,(int)local_120);
    bVar5 = local_120 == iVar3;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,
                    CONCAT71(local_108.field_2._M_allocated_capacity._1_7_,
                             local_108.field_2._M_local_buf[0]) + 1);
  }
  if (local_128 != &local_118) {
    operator_delete(local_128,CONCAT44(uStack_114,local_118) + 1);
  }
  local_e8 = &PTR__CastMessage_00129a40;
  if (local_50 != &local_40) {
    operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
  }
  if (local_98 != &local_88) {
    operator_delete(local_98,CONCAT71(uStack_87,local_88) + 1);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,CONCAT71(uStack_a7,local_a8) + 1);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8,CONCAT71(uStack_c7,local_c8) + 1);
  }
  return bVar5;
}

Assistant:

bool sendMessage(const Connection &conn, const std::string &ns, const std::string &message)
{
    if (s_verbose) {
        std::cout << "Sending to '" << dest << "': '" << ns << ": '" << message << "'" << std::endl;
    }

    CastMessage msg;
    msg._payload_type = CastMessage::STRING;
    msg._protocol_version = CastMessage::CASTV2_1_0;
    msg._namespace = ns;
    msg._source_id = "sender-0";
    msg._destination_id = dest.empty() ? "receiver-0" : dest;
    msg._payload_utf8 = message;

    const uint32_t byteSize = htonl(uint32_t(msg.size()));
    std::basic_string<uint8_t> buffer(sizeof byteSize, '\0');
    memcpy(buffer.data(), &byteSize, sizeof byteSize);

    std::basic_string<uint8_t> contents;
    contents.reserve(1024);
    if (!msg.serialize(&buffer)) {
        puts("Failed to serialize");
        return false;
    }
    return conn.write(buffer);
}